

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O0

int X509_check_akid(X509 *issuer,AUTHORITY_KEYID *akid)

{
  stack_st_GENERAL_NAME *sk;
  int iVar1;
  ASN1_INTEGER *x;
  size_t sVar2;
  GENERAL_NAME *pGVar3;
  X509_NAME *b;
  ulong local_40;
  size_t i;
  X509_NAME *nm;
  GENERAL_NAME *gen;
  GENERAL_NAMES *gens;
  AUTHORITY_KEYID *akid_local;
  X509 *issuer_local;
  
  if (akid == (AUTHORITY_KEYID *)0x0) {
    issuer_local._4_4_ = 0;
  }
  else if (((akid->keyid == (ASN1_OCTET_STRING *)0x0) || (issuer->ex_pcpathlen == 0)) ||
          (iVar1 = ASN1_OCTET_STRING_cmp(akid->keyid,(ASN1_OCTET_STRING *)issuer->ex_pcpathlen),
          iVar1 == 0)) {
    if (akid->serial != (ASN1_INTEGER *)0x0) {
      x = X509_get_serialNumber(issuer);
      iVar1 = ASN1_INTEGER_cmp(x,akid->serial);
      if (iVar1 != 0) {
        return 0x1f;
      }
    }
    if (akid->issuer != (GENERAL_NAMES *)0x0) {
      i = 0;
      sk = (stack_st_GENERAL_NAME *)akid->issuer;
      for (local_40 = 0; sVar2 = sk_GENERAL_NAME_num(sk), local_40 < sVar2; local_40 = local_40 + 1)
      {
        pGVar3 = sk_GENERAL_NAME_value(sk,local_40);
        if (pGVar3->type == 4) {
          i = *(size_t *)&pGVar3->d;
          break;
        }
      }
      if (i != 0) {
        b = X509_get_issuer_name(issuer);
        iVar1 = X509_NAME_cmp((X509_NAME *)i,b);
        if (iVar1 != 0) {
          return 0x1f;
        }
      }
    }
    issuer_local._4_4_ = 0;
  }
  else {
    issuer_local._4_4_ = 0x1e;
  }
  return issuer_local._4_4_;
}

Assistant:

int X509_check_akid(X509 *issuer, const AUTHORITY_KEYID *akid) {
  if (!akid) {
    return X509_V_OK;
  }

  // Check key ids (if present)
  if (akid->keyid && issuer->skid &&
      ASN1_OCTET_STRING_cmp(akid->keyid, issuer->skid)) {
    return X509_V_ERR_AKID_SKID_MISMATCH;
  }
  // Check serial number
  if (akid->serial &&
      ASN1_INTEGER_cmp(X509_get_serialNumber(issuer), akid->serial)) {
    return X509_V_ERR_AKID_ISSUER_SERIAL_MISMATCH;
  }
  // Check issuer name
  if (akid->issuer) {
    // Ugh, for some peculiar reason AKID includes SEQUENCE OF
    // GeneralName. So look for a DirName. There may be more than one but
    // we only take any notice of the first.
    GENERAL_NAMES *gens;
    GENERAL_NAME *gen;
    X509_NAME *nm = NULL;
    size_t i;
    gens = akid->issuer;
    for (i = 0; i < sk_GENERAL_NAME_num(gens); i++) {
      gen = sk_GENERAL_NAME_value(gens, i);
      if (gen->type == GEN_DIRNAME) {
        nm = gen->d.dirn;
        break;
      }
    }
    if (nm && X509_NAME_cmp(nm, X509_get_issuer_name(issuer))) {
      return X509_V_ERR_AKID_ISSUER_SERIAL_MISMATCH;
    }
  }
  return X509_V_OK;
}